

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Game::listenerThread(Game *this)

{
  int port;
  SOCKET connection_id;
  element_type *peVar1;
  Configuration *this_00;
  element_type *peVar2;
  element_type *peVar3;
  element_type *this_01;
  shared_ptr<Connection> local_a8;
  lock_guard<std::mutex> local_98;
  lock_guard<std::mutex> guard;
  undefined1 local_80 [24];
  undefined1 local_68 [8];
  shared_ptr<Connection> connection;
  DataSocket dataSocket;
  undefined1 local_1c [8];
  ServerSocket socket;
  Game *this_local;
  
  socket._4_8_ = this;
  peVar1 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_game_data);
  this_00 = GameData::GetConfiguration(peVar1);
  port = Configuration::GetPort(this_00);
  ServerSocket::ServerSocket((ServerSocket *)local_1c,port);
  ServerSocket::Listen((ServerSocket *)local_1c);
  while ((this->isRunning & 1U) != 0) {
    ServerSocket::Accept
              ((DataSocket *)
               &connection.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (ServerSocket *)local_1c);
    std::make_shared<Connection,DataSocket&>((DataSocket *)local_68);
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_68);
    local_80._22_2_ = 0;
    Connection::SetState(peVar2,(GameStates *)(local_80 + 0x16),&this->m_game_data);
    std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_68
              );
    Connection::GetState((Connection *)local_80);
    peVar3 = std::__shared_ptr_access<GameState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GameState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_80);
    std::shared_ptr<Connection>::shared_ptr
              ((shared_ptr<Connection> *)&guard,(shared_ptr<Connection> *)local_68);
    (*peVar3->_vptr_GameState[1])(peVar3,(shared_ptr<Connection> *)&guard);
    std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)&guard);
    std::shared_ptr<GameState>::~shared_ptr((shared_ptr<GameState> *)local_80);
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_68);
    Connection::ResetStateChanged(peVar2);
    std::lock_guard<std::mutex>::lock_guard(&local_98,&game_mutex);
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_68);
    this_01 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_68);
    connection_id = Connection::GetSocket(this_01);
    Connection::SetID(peVar2,connection_id);
    this->connection_id = this->connection_id + 1;
    peVar1 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_game_data);
    std::shared_ptr<Connection>::shared_ptr(&local_a8,(shared_ptr<Connection> *)local_68);
    GameData::AddConnection(peVar1,&local_a8);
    std::shared_ptr<Connection>::~shared_ptr(&local_a8);
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_68);
    Connection::Run(peVar2);
    std::lock_guard<std::mutex>::~lock_guard(&local_98);
    std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)local_68);
    DataSocket::~DataSocket
              ((DataSocket *)
               &connection.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  ServerSocket::~ServerSocket((ServerSocket *)local_1c);
  return;
}

Assistant:

void Game::listenerThread() {
    ServerSocket socket(m_game_data->GetConfiguration().GetPort());
    socket.Listen();
    while(isRunning) {
        DataSocket dataSocket = socket.Accept();
        auto connection = std::make_shared<Connection>(dataSocket);
        connection->SetState(GameStates::LOGIN, m_game_data);
        connection->GetState()->init(connection);
        connection->ResetStateChanged();
        std::lock_guard<std::mutex> guard(Game::game_mutex);
        // TODO: connection_id temporary for debugging
        // TODO: eventually connection_id could increment beyond the size of int
        connection->SetID(connection->GetSocket());
        ++connection_id;
        m_game_data->AddConnection(connection);
        connection->Run();
    }
}